

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::TestBody(NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  internal iVar3;
  Arena *pAVar4;
  char *in_R9;
  pointer *__ptr_1;
  pointer *__ptr_3;
  pointer *__ptr;
  char *pcVar5;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_320;
  internal local_318 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  AssertHelper local_308;
  string local_300;
  undefined1 local_2e0 [528];
  ArenaStringPtr local_d0;
  ArenaStringPtr local_c8 [7];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50;
  undefined8 local_4c;
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)local_2e0,(Arena *)0x0);
  output = &(this->
            super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).value_;
  iVar3 = (internal)MessageLite::SerializeToString((MessageLite *)local_2e0,output);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_318[0] = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_300,local_318,(AssertionResult *)"TestSerialize(message, &output_sink)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x454,local_300._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if (local_320._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_320._M_head_impl + 8))();
    }
    if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_310,local_310);
    }
    if (!(bool)iVar3) goto LAB_008cc39b;
  }
  local_308.data_._0_4_ = 0;
  paVar1 = &local_300.field_2;
  pcVar2 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,pcVar2,
             pcVar2 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  local_320._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_300._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_318,"0","this->GetOutput().size()",(int *)&local_308,(unsigned_long *)&local_320)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar5 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x455,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_300._M_dataplus._M_p + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  local_c8[6].tagged_ptr_.ptr_ = (TaggedStringPtr)(void *)0x0;
  _uStack_90 = 0;
  local_88 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0;
  uStack_58 = 0.0;
  local_50 = false;
  local_2e0._16_4_ = local_2e0._16_4_ | 0x1fff01;
  pAVar4 = (Arena *)local_2e0._8_8_;
  if ((local_2e0._8_8_ & 1) != 0) {
    pAVar4 = *(Arena **)(local_2e0._8_8_ & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_2e0 + 0x208),(string_view)(ZEXT816(0x1141ae9) << 0x40),pAVar4)
  ;
  local_2e0._16_4_ = local_2e0._16_4_ | 2;
  pAVar4 = (Arena *)local_2e0._8_8_;
  if ((local_2e0._8_8_ & 1) != 0) {
    pAVar4 = *(Arena **)(local_2e0._8_8_ & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set
            (&local_d0,(string_view)(ZEXT816(0x1141ae9) << 0x40),pAVar4);
  local_4c = 0;
  local_2e0._16_4_ = local_2e0._16_4_ | 0x600004;
  if ((local_2e0._8_8_ & 1) != 0) {
    local_2e0._8_8_ = *(undefined8 *)(local_2e0._8_8_ & 0xfffffffffffffffe);
  }
  pcVar5 = anon_var_dwarf_a12c75 + 5;
  protobuf::internal::ArenaStringPtr::Set
            (local_c8,(string_view)(ZEXT816(0x1141ae9) << 0x40),(Arena *)local_2e0._8_8_);
  iVar3 = (internal)MessageLite::SerializeToString((MessageLite *)local_2e0,output);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_318[0] = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_300,local_318,(AssertionResult *)"TestSerialize(message, &output_sink)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x46b,local_300._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != paVar1) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if (local_320._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_320._M_head_impl + 8))();
    }
    if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_310,local_310);
    }
    if (!(bool)iVar3) goto LAB_008cc39b;
  }
  local_308.data_._0_4_ = 0;
  pcVar2 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,pcVar2,
             pcVar2 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  local_320._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_300._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_318,"0","this->GetOutput().size()",(int *)&local_308,(unsigned_long *)&local_320)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x46c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_300._M_dataplus._M_p + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  uStack_90 = 1;
  local_2e0._16_4_ = local_2e0._16_4_ | 0x200;
  iVar3 = (internal)MessageLite::SerializeToString((MessageLite *)local_2e0,output);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_318[0] = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_300,local_318,(AssertionResult *)"TestSerialize(message, &output_sink)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x46f,local_300._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != paVar1) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if (local_320._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_320._M_head_impl + 8))();
    }
    if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_310,local_310);
    }
    if (!(bool)iVar3) goto LAB_008cc39b;
  }
  local_308.data_._0_4_ = 2;
  pcVar2 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,pcVar2,
             pcVar2 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  local_320._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_300._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_318,"2","this->GetOutput().size()",(int *)&local_308,(unsigned_long *)&local_320)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar5 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x470,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_300._M_dataplus._M_p + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  pcVar2 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,pcVar2,
             pcVar2 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_318,"\"\\x08\\x01\"","this->GetOutput()",(char (*) [3])0x117fcea,&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar5 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x471,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_300._M_dataplus._M_p + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  _uStack_90 = _uStack_90 & 0xffffffff00000000;
  local_2e0._16_4_ = local_2e0._16_4_ | 0x200;
  iVar3 = (internal)MessageLite::SerializeToString((MessageLite *)local_2e0,output);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_318[0] = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_300,local_318,(AssertionResult *)"TestSerialize(message, &output_sink)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x474,local_300._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != paVar1) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if (local_320._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_320._M_head_impl + 8))();
    }
    if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_310,local_310);
    }
    if (!(bool)iVar3) goto LAB_008cc39b;
  }
  local_308.data_._0_4_ = 0;
  pcVar2 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,pcVar2,
             pcVar2 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  local_320._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_300._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_318,"0","this->GetOutput().size()",(int *)&local_308,(unsigned_long *)&local_320)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar5 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x475,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_300._M_dataplus._M_p + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
LAB_008cc39b:
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_2e0);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceSerializeTest, DontSerializeDefaultValuesTest) {
  // check that serialized data contains only non-zero numeric fields/non-empty
  // string/byte fields.
  TestAllTypes message;
  TypeParam& output_sink = this->GetOutputSinkRef();

  // All default values -> no output.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  // Zero values -> still no output.
  message.set_optional_int32(0);
  message.set_optional_int64(0);
  message.set_optional_uint32(0);
  message.set_optional_uint64(0);
  message.set_optional_sint32(0);
  message.set_optional_sint64(0);
  message.set_optional_fixed32(0);
  message.set_optional_fixed64(0);
  message.set_optional_sfixed32(0);
  message.set_optional_sfixed64(0);
  message.set_optional_float(0);
  message.set_optional_double(0);
  message.set_optional_bool(false);
  message.set_optional_string("");
  message.set_optional_bytes("");
  message.set_optional_nested_enum(TestAllTypes::FOO);  // first enum entry
  message.set_optional_foreign_enum(FOREIGN_FOO);       // first enum entry
  message.set_optional_string_piece("");

  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  message.set_optional_int32(1);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(2, this->GetOutput().size());
  EXPECT_EQ("\x08\x01", this->GetOutput());

  message.set_optional_int32(0);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());
}